

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O2

TPZVec<int> * __thiscall
TPZDohrSubstructCondense<std::complex<long_double>_>::GatherVec
          (TPZDohrSubstructCondense<std::complex<long_double>_> *this,ENumbering origin,
          ENumbering destination)

{
  const_iterator cVar1;
  ostream *poVar2;
  TPZVec<int> *pTVar3;
  key_type local_18;
  
  local_18.second = origin;
  local_18.first = destination;
  cVar1 = std::
          _Rb_tree<std::pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>,_std::pair<const_std::pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>,_TPZVec<int>_>,_std::_Select1st<std::pair<const_std::pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>,_TPZVec<int>_>_>,_std::less<std::pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering,_TPZDohrSubstructCondense<std::complex<long_double>_>::ENumbering>,_TPZVec<int>_>_>_>
          ::find(&(this->fPermutationsScatter)._M_t,&local_18);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->fPermutationsScatter)._M_t._M_impl.super__Rb_tree_header) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Gathervec not found");
    std::endl<char,std::char_traits<char>>(poVar2);
    pTVar3 = &dummyvec;
    TPZVec<int>::Resize(&dummyvec,0);
  }
  else {
    pTVar3 = (TPZVec<int> *)&cVar1._M_node[1]._M_parent;
  }
  return pTVar3;
}

Assistant:

const TPZVec<int> &TPZDohrSubstructCondense<TVar>::GatherVec(ENumbering origin, ENumbering destination) const
{
	typename std::map<std::pair<ENumbering,ENumbering>, TPZVec<int> >::const_iterator it;
	it = fPermutationsScatter.find(std::pair<ENumbering,ENumbering>(destination,origin));
	if(it != fPermutationsScatter.end())
	{
		return it->second;
	}
	else
	{
		LOGPZ_ERROR(logger,"Gathervec not found");
		dummyvec.Resize(0);
		return dummyvec;
	}
}